

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O3

void hash_EmptyMap(HashMapEntry **map)

{
  HashMapEntry *pHVar1;
  HashMapEntry *__ptr;
  size_t i;
  long lVar2;
  
  lVar2 = 0;
  do {
    __ptr = map[lVar2];
    while (__ptr != (HashMapEntry *)0x0) {
      pHVar1 = __ptr->next;
      free(__ptr);
      __ptr = pHVar1;
    }
    map[lVar2] = (HashMapEntry *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10000);
  return;
}

Assistant:

void hash_EmptyMap(HashMap map)
{
	for (size_t i = 0; i < HASHMAP_NB_BUCKETS; i++) {
		struct HashMapEntry *ptr = map[i];

		while (ptr) {
			struct HashMapEntry *next = ptr->next;

			free(ptr);
			ptr = next;
		}
		map[i] = NULL;
	}
}